

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O2

vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_> * __thiscall
hiberlite::Database::getAllBeans<Person>
          (vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>
           *__return_storage_ptr__,Database *this)

{
  size_type sVar1;
  size_type __n;
  vector<long_long,_std::allocator<long_long>_> ids;
  _Vector_base<long_long,_std::allocator<long_long>_> local_58;
  bean_ptr<Person> local_40;
  
  getBeanIds<Person>((vector<long_long,_std::allocator<long_long>_> *)&local_58,this);
  __n = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
        (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3;
  (__return_storage_ptr__->
  super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<hiberlite::bean_ptr<Person>,_std::allocator<hiberlite::bean_ptr<Person>_>_>::reserve
            (__return_storage_ptr__,__n);
  for (sVar1 = 0; __n != sVar1; sVar1 = sVar1 + 1) {
    loadBean<Person>(&local_40,this,local_58._M_impl.super__Vector_impl_data._M_start[sVar1]);
    std::vector<hiberlite::bean_ptr<Person>,std::allocator<hiberlite::bean_ptr<Person>>>::
    emplace_back<hiberlite::bean_ptr<Person>>
              ((vector<hiberlite::bean_ptr<Person>,std::allocator<hiberlite::bean_ptr<Person>>> *)
               __return_storage_ptr__,&local_40);
    shared_res<hiberlite::real_bean<Person>_>::~shared_res
              (&local_40.super_shared_res<hiberlite::real_bean<Person>_>);
  }
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector< bean_ptr<C> > Database::getAllBeans()
{
	std::vector<sqlid_t> ids=getBeanIds<C>();
	size_t N=ids.size();
	std::vector< bean_ptr<C> > ans;
	ans.reserve(N);
	for(size_t i=0;i<N;i++)
		ans.push_back( loadBean<C>(ids[i]) );
	return ans;
}